

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_tree.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int model;
  UndoHistory history;
  Cmd cmd8;
  Cmd cmd7;
  Cmd cmd6;
  Cmd cmd5;
  Cmd cmd4;
  Cmd cmd3;
  Cmd cmd2;
  Cmd cmd1;
  uint local_104;
  bool local_fd;
  int local_fc;
  UndoHistory local_f8;
  UndoCommand local_d0;
  int *local_c8;
  undefined8 local_c0;
  UndoCommand local_b8;
  int *local_b0;
  undefined8 local_a8;
  UndoCommand local_a0;
  int *local_98;
  undefined8 local_90;
  UndoCommand local_88;
  int *local_80;
  undefined8 local_78;
  UndoCommand local_70;
  int *local_68;
  undefined8 local_60;
  UndoCommand local_58;
  int *local_50;
  undefined8 local_48;
  UndoCommand local_40;
  int *local_38;
  undefined8 local_30;
  UndoCommand local_28;
  int *local_20;
  undefined8 local_18;
  
  local_c8 = &local_fc;
  local_fc = 0;
  local_28._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_18 = 1;
  local_40._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_30 = 0x100000002;
  local_58._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_48 = 0x200000003;
  local_70._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_60 = 0x300000004;
  local_88._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_78 = 0x200000005;
  local_a0._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_90 = 0x500000006;
  local_b8._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_a8 = 0x500000007;
  local_d0._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_c0 = 0x700000008;
  local_b0 = local_c8;
  local_98 = local_c8;
  local_80 = local_c8;
  local_68 = local_c8;
  local_50 = local_c8;
  local_38 = local_c8;
  local_20 = local_c8;
  undo::UndoHistory::UndoHistory(&local_f8,(UndoHistoryDelegate *)0x0);
  *local_20 = (int)local_18;
  undo::UndoHistory::add(&local_f8,&local_28);
  *local_38 = (int)local_30;
  undo::UndoHistory::add(&local_f8,&local_40);
  *local_50 = (int)local_48;
  undo::UndoHistory::add(&local_f8,&local_58);
  *local_68 = (int)local_60;
  undo::UndoHistory::add(&local_f8,&local_70);
  undo::UndoHistory::undo(&local_f8);
  undo::UndoHistory::undo(&local_f8);
  *local_80 = (int)local_78;
  undo::UndoHistory::add(&local_f8,&local_88);
  *local_98 = (int)local_90;
  undo::UndoHistory::add(&local_f8,&local_a0);
  undo::UndoHistory::undo(&local_f8);
  *local_b0 = (int)local_a8;
  undo::UndoHistory::add(&local_f8,&local_b8);
  *local_c8 = (int)local_c0;
  undo::UndoHistory::add(&local_f8,&local_d0);
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2a);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 7;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2b);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 6;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2c);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 5;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2d);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 4;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2e);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 3;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2f);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 2;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x30);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 1;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x31);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 0;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x32);
  local_104 = local_104 & 0xffffff00;
  local_fd = undo::UndoHistory::canUndo(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x33);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 1;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x35);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 2;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x36);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 3;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x37);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 4;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x38);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 5;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x39);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 6;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3a);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 7;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3b);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3c);
  local_104 = local_104 & 0xffffff00;
  local_fd = undo::UndoHistory::canRedo(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x3d);
  bVar1 = undo::UndoHistory::canUndo(&local_f8);
  if (bVar1) {
    do {
      undo::UndoHistory::undo(&local_f8);
      bVar1 = undo::UndoHistory::canUndo(&local_f8);
    } while (bVar1);
  }
  local_104 = 0;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x4e);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 1;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x4f);
  local_104 = local_104 & 0xffffff00;
  local_fd = undo::UndoHistory::deleteFirstState(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x50);
  bVar1 = undo::UndoHistory::canRedo(&local_f8);
  if (bVar1) {
    do {
      undo::UndoHistory::redo(&local_f8);
      bVar1 = undo::UndoHistory::canRedo(&local_f8);
    } while (bVar1);
  }
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x51);
  local_104 = CONCAT31(local_104._1_3_,1);
  local_fd = undo::UndoHistory::deleteFirstState(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x57);
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x59);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 7;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5a);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 6;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5b);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 5;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5c);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 4;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5d);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 3;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5e);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 2;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5f);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 1;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x60);
  local_104 = local_104 & 0xffffff00;
  local_fd = undo::UndoHistory::canUndo(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x61);
  bVar1 = undo::UndoHistory::canRedo(&local_f8);
  if (bVar1) {
    do {
      undo::UndoHistory::redo(&local_f8);
      bVar1 = undo::UndoHistory::canRedo(&local_f8);
    } while (bVar1);
  }
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x62);
  local_104 = CONCAT31(local_104._1_3_,1);
  local_fd = undo::UndoHistory::deleteFirstState(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x68);
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6a);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 7;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6b);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 6;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6c);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 5;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6d);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 2;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6e);
  local_104 = local_104 & 0xffffff00;
  local_fd = undo::UndoHistory::canUndo(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x6f);
  bVar1 = undo::UndoHistory::canRedo(&local_f8);
  if (bVar1) {
    do {
      undo::UndoHistory::redo(&local_f8);
      bVar1 = undo::UndoHistory::canRedo(&local_f8);
    } while (bVar1);
  }
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x70);
  local_104 = CONCAT31(local_104._1_3_,1);
  local_fd = undo::UndoHistory::deleteFirstState(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x76);
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x78);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 7;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x79);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 5;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x7a);
  local_104 = local_104 & 0xffffff00;
  local_fd = undo::UndoHistory::canUndo(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x7b);
  bVar1 = undo::UndoHistory::canRedo(&local_f8);
  if (bVar1) {
    do {
      undo::UndoHistory::redo(&local_f8);
      bVar1 = undo::UndoHistory::canRedo(&local_f8);
    } while (bVar1);
  }
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x7c);
  local_104 = CONCAT31(local_104._1_3_,1);
  local_fd = undo::UndoHistory::deleteFirstState(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x82);
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x84);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 7;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x85);
  local_104 = local_104 & 0xffffff00;
  local_fd = undo::UndoHistory::canUndo(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x86);
  undo::UndoHistory::redo(&local_f8);
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x87);
  local_104 = local_104 & 0xffffff00;
  local_fd = undo::UndoHistory::deleteFirstState(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x8d);
  local_104 = 8;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x8e);
  undo::UndoHistory::undo(&local_f8);
  local_104 = 7;
  expect_eq<int,int>((int *)&local_104,&local_fc,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x8f);
  local_104._0_1_ = true;
  local_fd = undo::UndoHistory::deleteFirstState(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x91);
  local_104._0_1_ = false;
  local_fd = undo::UndoHistory::canUndo(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x92);
  local_104 = (uint)local_104._1_3_ << 8;
  local_fd = undo::UndoHistory::canRedo(&local_f8);
  expect_eq<bool,bool>
            ((bool *)&local_104,&local_fd,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x93);
  undo::UndoHistory::~UndoHistory(&local_f8);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // 1 --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);
  Cmd cmd3(model, 3, 2);
  Cmd cmd4(model, 4, 3);
  Cmd cmd5(model, 5, 2);
  Cmd cmd6(model, 6, 5);
  Cmd cmd7(model, 7, 5);
  Cmd cmd8(model, 8, 7);

  UndoHistory history;
  cmd1.redo(); history.add(&cmd1);
  cmd2.redo(); history.add(&cmd2);
  cmd3.redo(); history.add(&cmd3);
  cmd4.redo(); history.add(&cmd4);
  history.undo();
  history.undo();
  cmd5.redo(); history.add(&cmd5);
  cmd6.redo(); history.add(&cmd6);
  history.undo();
  cmd7.redo(); history.add(&cmd7);
  cmd8.redo(); history.add(&cmd8);

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(4, model);
  history.undo(); EXPECT_EQ(3, model);
  history.undo(); EXPECT_EQ(2, model);
  history.undo(); EXPECT_EQ(1, model);
  history.undo(); EXPECT_EQ(0, model);
  EXPECT_FALSE(history.canUndo());

  history.redo(); EXPECT_EQ(1, model);
  history.redo(); EXPECT_EQ(2, model);
  history.redo(); EXPECT_EQ(3, model);
  history.redo(); EXPECT_EQ(4,  model);
  history.redo(); EXPECT_EQ(5,  model);
  history.redo(); EXPECT_EQ(6,  model);
  history.redo(); EXPECT_EQ(7,  model);
  history.redo(); EXPECT_EQ(8,  model);
  EXPECT_FALSE(history.canRedo());

  // Delete states ----------------------------------------

  auto undoAll = [&]{
    while (history.canUndo())
      history.undo();
  };
  auto redoAll = [&]{
    while (history.canRedo())
      history.redo();
  };

  // Cannot delete state 1 if we are in that state
  // 1 --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  undoAll(); EXPECT_EQ(0, model);
  history.redo(); EXPECT_EQ(1, model);
  EXPECT_FALSE(history.deleteFirstState());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 1
  // x --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(4, model);
  history.undo(); EXPECT_EQ(3, model);
  history.undo(); EXPECT_EQ(2, model);
  history.undo(); EXPECT_EQ(1, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 2 (we cannot go back to 3 or 4 from 5 because 2 is gone)
  // x --- x --- x --- x   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(2, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 5 (we cannot go back to 6 from 7 because 5 is gone)
  // x --- x --- x --- x   -------- 7 --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(5, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 7
  // x --- x --- x --- x   -------- x --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  EXPECT_FALSE(history.canUndo());
  history.redo(); EXPECT_EQ(8, model);

  // Cannot delete state 8 because is the current state
  // x --- x --- x --- x   -------- x --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_FALSE(history.deleteFirstState());
  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  // Now we can delete the whole history
  EXPECT_TRUE(history.deleteFirstState());
  EXPECT_FALSE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
}